

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

SchemeObject * Eval(SchemeObject *exp,SchemeObject *environ)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  SchemeObject *pSVar4;
  SchemeObject **ppSVar5;
  SchemeObject *extraout_RAX;
  
  cVar1 = IsSelfEvaluating(exp);
  while( true ) {
    if (cVar1 != '\0') {
      return exp;
    }
    cVar1 = IsVariable(exp);
    if (cVar1 != '\0') {
      pSVar2 = LookupVariableValue(exp,environ);
      return pSVar2;
    }
    cVar1 = IsQuote(exp);
    if (cVar1 != '\0') {
      pSVar2 = Cdr(exp);
      pSVar2 = Car(pSVar2);
      return pSVar2;
    }
    cVar1 = IsAssignment(exp);
    if (cVar1 != '\0') break;
    cVar1 = IsDefine(exp);
    if (cVar1 != '\0') {
      pSVar2 = DefinitionVariable(exp);
      pSVar3 = DefinitionValue(exp);
      pSVar3 = Eval(pSVar3,environ);
      DefineVariable(pSVar2,pSVar3,environ);
      goto LAB_00102717;
    }
    cVar1 = IsIf(exp);
    if (cVar1 == '\0') {
      cVar1 = IsLambda(exp);
      if (cVar1 != '\0') {
        pSVar2 = LambdaParameters(exp);
        pSVar3 = LambdaBody(exp);
        pSVar2 = MakeCompoundProc(pSVar2,pSVar3,environ);
        return pSVar2;
      }
      cVar1 = IsBegin(exp);
      if (cVar1 != '\0') {
        pSVar2 = BeginAction(exp);
        while (cVar1 = IsLastExp(pSVar2), cVar1 == '\0') {
          pSVar3 = FirstExp(pSVar2);
          Eval(pSVar3,environ);
          pSVar2 = RestExps(pSVar2);
        }
        goto LAB_00102599;
      }
      cVar1 = IsCond(exp);
      if (cVar1 == '\0') {
        cVar1 = IsLet(exp);
        if (cVar1 == '\0') {
          cVar1 = IsAnd(exp);
          if (cVar1 == '\0') {
            cVar1 = IsOr(exp);
            if (cVar1 == '\0') {
              pSVar2 = exp;
              cVar1 = IsApplication(exp);
              if (cVar1 == '\0') {
                Eval_cold_2();
LAB_00102776:
                Eval_cold_1();
                pSVar3 = MakeSymbol("+");
                pSVar4 = MakePrimitiveProc(AddProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("-");
                pSVar4 = MakePrimitiveProc(SubProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("*");
                pSVar4 = MakePrimitiveProc(MulProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("/");
                pSVar4 = MakePrimitiveProc(QuotientProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("quotient");
                pSVar4 = MakePrimitiveProc(QuotientProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("remainder");
                pSVar4 = MakePrimitiveProc(RemainderProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("=");
                pSVar4 = MakePrimitiveProc(IsNumberEqualProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("<");
                pSVar4 = MakePrimitiveProc(IsLessThanProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol(">");
                pSVar4 = MakePrimitiveProc(IsGreaterThanProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("cons");
                pSVar4 = MakePrimitiveProc(ConsProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("car");
                pSVar4 = MakePrimitiveProc(CarProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("cdr");
                pSVar4 = MakePrimitiveProc(CdrProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("set-car!");
                pSVar4 = MakePrimitiveProc(SetCarProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("set-cdr!");
                pSVar4 = MakePrimitiveProc(SetCdrProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("list");
                pSVar4 = MakePrimitiveProc(ListProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("eq?");
                pSVar4 = MakePrimitiveProc(IsEqProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("null?");
                pSVar4 = MakePrimitiveProc(IsNullProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("boolean?");
                pSVar4 = MakePrimitiveProc(IsBooleanProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("symbol?");
                pSVar4 = MakePrimitiveProc(IsSymbolProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("integer?");
                pSVar4 = MakePrimitiveProc(IsIntegerProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("char?");
                pSVar4 = MakePrimitiveProc(IsCharProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("string?");
                pSVar4 = MakePrimitiveProc(IsStringProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("pair?");
                pSVar4 = MakePrimitiveProc(IsPairProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("procedure?");
                pSVar4 = MakePrimitiveProc(IsProcedureProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("number->string");
                pSVar4 = MakePrimitiveProc(NumberToStringProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("string->number");
                pSVar4 = MakePrimitiveProc(StringToNumberProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("symbol->string");
                pSVar4 = MakePrimitiveProc(SymbolToStringProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("string->symbol");
                pSVar4 = MakePrimitiveProc(StringToSymbolProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("char->integer");
                pSVar4 = MakePrimitiveProc(CharToIntegerProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("integer->char");
                pSVar4 = MakePrimitiveProc(IntegerToCharProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("apply");
                pSVar4 = MakePrimitiveProc(ApplyProc);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("interaction-environment");
                pSVar4 = MakePrimitiveProc(InteractionEnvironmentProc);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("null-environment");
                pSVar4 = MakePrimitiveProc(NullEnvironmentProc);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("environment");
                pSVar4 = MakePrimitiveProc(EnvironemntProc);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("eval");
                pSVar4 = MakePrimitiveProc(EvalProc);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("load");
                pSVar4 = MakePrimitiveProc(LoadProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("open-input-port");
                pSVar4 = MakePrimitiveProc(OpenInputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("close-input-port");
                pSVar4 = MakePrimitiveProc(CloseInputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("input-port?");
                pSVar4 = MakePrimitiveProc(IsInputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("read");
                pSVar4 = MakePrimitiveProc(ReadProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("read-char");
                pSVar4 = MakePrimitiveProc(ReadCharProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("eof-object?");
                pSVar4 = MakePrimitiveProc(IsEOFObjectProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("open-output-port");
                pSVar4 = MakePrimitiveProc(OpenOutputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("close-output-port");
                pSVar4 = MakePrimitiveProc(CloseOutputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("output-port?");
                pSVar4 = MakePrimitiveProc(IsOutputPortProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("write-char");
                pSVar4 = MakePrimitiveProc(WriteCharProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("write");
                pSVar4 = MakePrimitiveProc(WriteProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                pSVar3 = MakeSymbol("error");
                pSVar4 = MakePrimitiveProc(ErrorProcedure);
                DefineVariable(pSVar3,pSVar4,pSVar2);
                return extraout_RAX;
              }
              pSVar2 = Operator(exp);
              pSVar3 = Eval(pSVar2,environ);
              pSVar2 = Operands(exp);
              pSVar4 = ListOfValues(pSVar2,environ);
              cVar1 = IsPrimitiveProc(pSVar3);
              if ((cVar1 == '\0') || ((pSVar3->data).pair.car != (SchemeObject *)EvalProc)) {
                cVar1 = IsPrimitiveProc(pSVar3);
                if ((cVar1 != '\0') && ((pSVar3->data).pair.car == (SchemeObject *)ApplyProc)) {
                  pSVar3 = ApplyOperator(pSVar4);
                  pSVar4 = ApplyOperands(pSVar4);
                }
                cVar1 = IsPrimitiveProc(pSVar3);
                if (cVar1 != '\0') {
                  pSVar2 = (SchemeObject *)(*(code *)(pSVar3->data).symbol.value)(pSVar4);
                  return pSVar2;
                }
                pSVar2 = pSVar3;
                cVar1 = IsCompoundProc(pSVar3);
                if (cVar1 == '\0') goto LAB_00102776;
                environ = ExtendEnvironment((pSVar3->data).pair.car,pSVar4,
                                            (pSVar3->data).compound_proc.env);
                exp = MakeBegin((pSVar3->data).pair.cdr);
              }
              else {
                exp = Car(pSVar4);
                pSVar2 = Cdr(pSVar4);
                environ = Car(pSVar2);
              }
              goto LAB_001025a4;
            }
            pSVar2 = OrTests(exp);
            cVar1 = IsTheEmptyList(pSVar2);
            if (cVar1 != '\0') {
LAB_0010274d:
              ppSVar5 = &False;
              goto LAB_0010271e;
            }
            while (cVar1 = IsLastExp(pSVar2), cVar1 == '\0') {
              pSVar3 = FirstExp(pSVar2);
              pSVar3 = Eval(pSVar3,environ);
              cVar1 = IsTrue(pSVar3);
              if (cVar1 != '\0') goto LAB_00102756;
              pSVar2 = RestExps(pSVar2);
            }
          }
          else {
            pSVar2 = AndTests(exp);
            cVar1 = IsTheEmptyList(pSVar2);
            if (cVar1 != '\0') {
LAB_00102756:
              ppSVar5 = &True;
              goto LAB_0010271e;
            }
            while (cVar1 = IsLastExp(pSVar2), cVar1 == '\0') {
              pSVar3 = FirstExp(pSVar2);
              pSVar3 = Eval(pSVar3,environ);
              cVar1 = IsFalse(pSVar3);
              if (cVar1 != '\0') goto LAB_0010274d;
              pSVar2 = RestExps(pSVar2);
            }
          }
LAB_00102599:
          exp = FirstExp(pSVar2);
        }
        else {
          exp = LetToApplication(exp);
        }
      }
      else {
        exp = CondToIf(exp);
      }
    }
    else {
      pSVar2 = IfPredicate(exp);
      pSVar2 = Eval(pSVar2,environ);
      cVar1 = IsTrue(pSVar2);
      if (cVar1 == '\0') {
        exp = IfAlternative(exp);
      }
      else {
        exp = IfConsequent(exp);
      }
    }
LAB_001025a4:
    cVar1 = IsSelfEvaluating(exp);
  }
  pSVar2 = AssignmentVariable(exp);
  pSVar3 = AssignmentValue(exp);
  pSVar3 = Eval(pSVar3,environ);
  SetVariableValue(pSVar2,pSVar3,environ);
LAB_00102717:
  ppSVar5 = &OkSymbol;
LAB_0010271e:
  return *ppSVar5;
}

Assistant:

extern SchemeObject*
Eval(SchemeObject* exp, SchemeObject* environ)
{
    SchemeObject* procedure;
    SchemeObject* arguments;
    SchemeObject* result;

    tail:
    if (IsSelfEvaluating(exp)) {
        return exp;
    } else if (IsVariable(exp)) {
        return LookupVariableValue(exp, environ);
    } else if (IsQuote(exp)) {
        return TextOfQuotation(exp);
    } else if (IsAssignment(exp)) {
        return EvalAssignment(exp, environ);
    } else if (IsDefine(exp)) {
        return EvalDefinition(exp, environ);
    } else if (IsIf(exp)) {
        exp = IsTrue(Eval(IfPredicate(exp), environ)) ? IfConsequent(exp) : IfAlternative(exp);
        goto tail;
    } else if (IsLambda(exp)) {
        return MakeCompoundProc(LambdaParameters(exp), LambdaBody(exp), environ);
    } else if (IsBegin(exp)) {
        exp = BeginAction(exp);

        while (!IsLastExp(exp)) {
            Eval(FirstExp(exp), environ);
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);

        goto tail;
    } else if (IsCond(exp)) {
        exp = CondToIf(exp);
        goto tail;
    } else if (IsLet(exp)) {
        exp = LetToApplication(exp);
        goto tail;
    } else if (IsAnd(exp)) {
        exp = AndTests(exp);
        if (IsTheEmptyList(exp)) {
            return True;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsFalse(result)) {
                return False;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsOr(exp)) {
        exp = OrTests(exp);
        if (IsTheEmptyList(exp)) {
            return False;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsTrue(result)) {
                return True;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsApplication(exp)) {
        procedure = Eval(Operator(exp), environ);
        arguments = ListOfValues(Operands(exp), environ);

        /* handle eval specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == EvalProc) {
            exp = EvalExpression(arguments);
            environ = EvalEnvironment(arguments);
            goto tail;
        }

        /* handle apply specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == ApplyProc) {
            procedure = ApplyOperator(arguments);
            arguments = ApplyOperands(arguments);
        }

        if (IsPrimitiveProc(procedure)) {
            return (procedure->data.primitive_proc.fn)(arguments);
        } else if (IsCompoundProc(procedure)) {
            environ = ExtendEnvironment(procedure->data.compound_proc.parameters,
                                        arguments,
                                        procedure->data.compound_proc.env);
            exp = MakeBegin(procedure->data.compound_proc.body);
            goto tail;
        } else {
            fprintf(stderr, "unknown procedure type.\n");
            exit(1);
        }
    } else {
        fprintf(stderr, "cannot eval unknown expression type.\n");
        exit(1);
    }
    fprintf(stderr, "eval illegal state.\n");
    exit(1);
}